

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

UTimeZoneNameTypeIndex icu_63::ZNames::ZNamesLoader::nameTypeFromKey(char *key)

{
  char cVar1;
  char cVar2;
  UTimeZoneNameTypeIndex local_2c;
  UTimeZoneNameTypeIndex local_28;
  UTimeZoneNameTypeIndex local_24;
  UTimeZoneNameTypeIndex local_20;
  char c1;
  char c0;
  char *key_local;
  
  cVar1 = *key;
  if (((cVar1 == '\0') || (cVar2 = key[1], cVar2 == '\0')) || (key[2] != '\0')) {
    key_local._4_4_ = UTZNM_INDEX_UNKNOWN;
  }
  else if (cVar1 == 'l') {
    if (cVar2 == 'g') {
      local_20 = UTZNM_INDEX_LONG_GENERIC;
    }
    else {
      if (cVar2 == 's') {
        local_24 = UTZNM_INDEX_LONG_STANDARD;
      }
      else {
        local_24 = UTZNM_INDEX_UNKNOWN;
        if (cVar2 == 'd') {
          local_24 = UTZNM_INDEX_LONG_DAYLIGHT;
        }
      }
      local_20 = local_24;
    }
    key_local._4_4_ = local_20;
  }
  else if (cVar1 == 's') {
    if (cVar2 == 'g') {
      local_28 = UTZNM_INDEX_SHORT_GENERIC;
    }
    else {
      if (cVar2 == 's') {
        local_2c = UTZNM_INDEX_SHORT_STANDARD;
      }
      else {
        local_2c = UTZNM_INDEX_UNKNOWN;
        if (cVar2 == 'd') {
          local_2c = UTZNM_INDEX_SHORT_DAYLIGHT;
        }
      }
      local_28 = local_2c;
    }
    key_local._4_4_ = local_28;
  }
  else if ((cVar1 == 'e') && (cVar2 == 'c')) {
    key_local._4_4_ = UTZNM_INDEX_EXEMPLAR_LOCATION;
  }
  else {
    key_local._4_4_ = UTZNM_INDEX_UNKNOWN;
  }
  return key_local._4_4_;
}

Assistant:

static UTimeZoneNameTypeIndex nameTypeFromKey(const char *key) {
        char c0, c1;
        if ((c0 = key[0]) == 0 || (c1 = key[1]) == 0 || key[2] != 0) {
            return UTZNM_INDEX_UNKNOWN;
        }
        if (c0 == 'l') {
            return c1 == 'g' ? UTZNM_INDEX_LONG_GENERIC :
                    c1 == 's' ? UTZNM_INDEX_LONG_STANDARD :
                        c1 == 'd' ? UTZNM_INDEX_LONG_DAYLIGHT : UTZNM_INDEX_UNKNOWN;
        } else if (c0 == 's') {
            return c1 == 'g' ? UTZNM_INDEX_SHORT_GENERIC :
                    c1 == 's' ? UTZNM_INDEX_SHORT_STANDARD :
                        c1 == 'd' ? UTZNM_INDEX_SHORT_DAYLIGHT : UTZNM_INDEX_UNKNOWN;
        } else if (c0 == 'e' && c1 == 'c') {
            return UTZNM_INDEX_EXEMPLAR_LOCATION;
        }
        return UTZNM_INDEX_UNKNOWN;
    }